

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  int iVar12;
  uint uVar13;
  uint uVar14;
  _func_int *p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var4 = this->_vptr_Clip_x86_avx;
    lVar10 = 0;
    do {
      pauVar11 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(&this->field_0xd0 + (long)pp_Var4[-3]);
      if ((int)uVar8 < 8) {
        uVar13 = 0;
      }
      else {
        auVar7 = vshufps_avx(auVar16,auVar16,0);
        auVar18._16_16_ = auVar7;
        auVar18._0_16_ = auVar7;
        auVar16 = vshufps_avx(auVar16,auVar16,0x55);
        auVar17._16_16_ = auVar16;
        auVar17._0_16_ = auVar16;
        iVar12 = 7;
        do {
          auVar6 = vmaxps_avx(auVar18,*pauVar11);
          auVar6 = vminps_avx(auVar6,auVar17);
          *pauVar11 = auVar6;
          pauVar11 = pauVar11 + 1;
          iVar12 = iVar12 + 8;
        } while (iVar12 < (int)uVar8);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        uVar13 = uVar8 & 0xfffffff8;
      }
      if ((int)(uVar13 | 3) < (int)uVar8) {
        auVar7 = vshufps_avx(auVar16,auVar16,0);
        auVar16 = vshufps_avx(auVar16,auVar16,0x55);
        uVar14 = uVar13;
        do {
          auVar5 = vmaxps_avx(auVar7,*(undefined1 (*) [16])*pauVar11);
          auVar5 = vminps_avx(auVar5,auVar16);
          *(undefined1 (*) [16])*pauVar11 = auVar5;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar13 = uVar14 + 4;
          iVar12 = uVar14 + 7;
          uVar14 = uVar13;
        } while (iVar12 < (int)uVar8);
      }
      if (uVar8 - uVar13 != 0 && (int)uVar13 <= (int)uVar8) {
        lVar9 = 0;
        do {
          p_Var15 = pp_Var4[-3];
          fVar1 = *(float *)(&this->field_0xd0 + (long)p_Var15);
          fVar2 = *(float *)(*pauVar11 + lVar9 * 4);
          if (*(float *)(*pauVar11 + lVar9 * 4) < fVar1) {
            *(float *)(*pauVar11 + lVar9 * 4) = fVar1;
            p_Var15 = pp_Var4[-3];
            fVar2 = fVar1;
          }
          if (*(float *)(&this->field_0xd4 + (long)p_Var15) < fVar2) {
            *(float *)(*pauVar11 + lVar9 * 4) = *(float *)(&this->field_0xd4 + (long)p_Var15);
          }
          lVar9 = lVar9 + 1;
        } while (uVar8 - uVar13 != (int)lVar9);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar3);
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}